

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  uint32 uVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  Reflection *this;
  uint8 *puVar4;
  uint8 *local_30;
  
  local_30 = target;
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  io::EpsCopyOutputStream::EnsureSpace(stream,&local_30);
  *local_30 = '\v';
  uVar1 = *(uint32 *)(field + 0x44);
  local_30[1] = '\x10';
  puVar4 = local_30 + 2;
  local_30 = local_30 + 1;
  local_30 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar4);
  pMVar3 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  *local_30 = '\x1a';
  puVar4 = local_30 + 1;
  uVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0xc])(pMVar3);
  puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar4);
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0xe])(pMVar3,puVar4,stream);
  local_30 = (uint8 *)CONCAT44(extraout_var,iVar2);
  io::EpsCopyOutputStream::EnsureSpace(stream,&local_30);
  *local_30 = '\f';
  return local_30 + 1;
}

Assistant:

uint8* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessageToArray(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}